

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestInfo::TestInfo
          (TestInfo *this,string *a_test_suite_name,string *a_name,char *a_type_param,
          char *a_value_param,CodeLocation *a_code_location,TypeId fixture_class_id,
          TestFactoryBase *factory)

{
  CodeLocation *__s;
  char *__s_00;
  pointer local_f8;
  pointer local_d0;
  bool local_7b;
  allocator<char> local_7a;
  undefined1 local_79;
  pointer local_78;
  byte local_6b;
  allocator<char> local_6a;
  undefined1 local_69;
  pointer local_68;
  allocator<char> local_49;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  CodeLocation *local_38;
  CodeLocation *a_code_location_local;
  char *a_value_param_local;
  char *a_type_param_local;
  string *a_name_local;
  string *a_test_suite_name_local;
  TestInfo *this_local;
  
  local_38 = a_code_location;
  a_code_location_local = (CodeLocation *)a_value_param;
  a_value_param_local = a_type_param;
  a_type_param_local = (char *)a_name;
  a_name_local = a_test_suite_name;
  a_test_suite_name_local = &this->test_suite_name_;
  std::__cxx11::string::string((string *)this,(string *)a_test_suite_name);
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_48._M_current = (char *)std::__cxx11::string::end();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)&this->name_,local_40,local_48,&local_49);
  std::allocator<char>::~allocator(&local_49);
  local_69 = 0;
  local_6b = 0;
  if (a_value_param_local == (char *)0x0) {
    local_d0 = (pointer)0x0;
  }
  else {
    local_d0 = (pointer)operator_new(0x20);
    __s_00 = a_value_param_local;
    local_69 = 1;
    local_68 = local_d0;
    std::allocator<char>::allocator();
    local_6b = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d0,__s_00,&local_6a);
  }
  local_69 = 0;
  std::unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>::
  unique_ptr<std::default_delete<std::__cxx11::string_const>,void>
            ((unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>
              *)&this->type_param_,local_d0);
  if ((local_6b & 1) != 0) {
    std::allocator<char>::~allocator(&local_6a);
  }
  local_79 = 0;
  local_7b = a_code_location_local == (CodeLocation *)0x0;
  if (local_7b) {
    local_f8 = (pointer)0x0;
  }
  else {
    local_f8 = (pointer)operator_new(0x20);
    __s = a_code_location_local;
    local_79 = 1;
    local_78 = local_f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_f8,(char *)__s,&local_7a);
  }
  local_79 = 0;
  local_7b = !local_7b;
  std::unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>::
  unique_ptr<std::default_delete<std::__cxx11::string_const>,void>
            ((unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>
              *)&this->value_param_,local_f8);
  if (local_7b) {
    std::allocator<char>::~allocator(&local_7a);
  }
  internal::CodeLocation::CodeLocation(&this->location_,a_code_location);
  this->fixture_class_id_ = fixture_class_id;
  this->should_run_ = false;
  this->is_disabled_ = false;
  this->matches_filter_ = false;
  this->is_in_another_shard_ = false;
  this->factory_ = factory;
  TestResult::TestResult(&this->result_);
  return;
}

Assistant:

TestInfo::TestInfo(const std::string& a_test_suite_name,
                   const std::string& a_name, const char* a_type_param,
                   const char* a_value_param,
                   internal::CodeLocation a_code_location,
                   internal::TypeId fixture_class_id,
                   internal::TestFactoryBase* factory)
    : test_suite_name_(a_test_suite_name),
      // begin()/end() is MSVC 17.3.3 ASAN crash workaround (GitHub issue #3997)
      name_(a_name.begin(), a_name.end()),
      type_param_(a_type_param ? new std::string(a_type_param) : nullptr),
      value_param_(a_value_param ? new std::string(a_value_param) : nullptr),
      location_(a_code_location),
      fixture_class_id_(fixture_class_id),
      should_run_(false),
      is_disabled_(false),
      matches_filter_(false),
      is_in_another_shard_(false),
      factory_(factory),
      result_() {}